

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libmeshb7.c
# Opt level: O3

int GmfGetBlock(int64_t MshIdx,int KwdCod,int64_t BegIdx,int64_t EndIdx,int MapTyp,void *MapTab,
               void *prc,...)

{
  __jmp_buf_tag *__env;
  long lVar1;
  undefined1 uVar2;
  int iVar3;
  ulong uVar4;
  char in_AL;
  int iVar5;
  int iVar6;
  int iVar7;
  undefined8 uVar8;
  long lVar9;
  double *pdVar10;
  double *pdVar11;
  long lVar12;
  double dVar13;
  ulong uVar14;
  char *pcVar15;
  uint *puVar16;
  long lVar17;
  ulong uVar18;
  uint uVar19;
  long lVar20;
  ulong *puVar21;
  long lVar22;
  long lVar23;
  ulong uVar24;
  void *pvVar25;
  uint uVar26;
  uint uVar27;
  __jmp_buf_tag *p_Var28;
  ulong uVar29;
  uint uVar30;
  double *pdVar31;
  ulong uVar32;
  double *pdVar33;
  ulong uVar34;
  bool bVar35;
  undefined4 in_XMM0_Da;
  float fVar36;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined8 in_stack_00000010;
  int UsrTyp [1000];
  size_t UsrLen [1000];
  int FilTyp [1000];
  char *UsrBas [1000];
  ulong *local_6000;
  aiocb local_5f48;
  ulong local_5f20;
  long local_5f18;
  ulong local_5f10;
  long local_5f08;
  ulong local_5f00;
  long local_5ef8;
  ulong local_5ef0;
  ulong local_5ee8;
  long local_5ee0;
  ulong local_5ed8;
  __jmp_buf_tag *local_5ed0;
  double *local_5ec8;
  double *local_5ec0;
  double *local_5eb8;
  ulong local_5eb0;
  ulong local_5ea8 [6];
  undefined4 local_5e78;
  undefined8 local_5e68;
  undefined8 local_5e58;
  undefined8 local_5e48;
  undefined8 local_5e38;
  undefined8 local_5e28;
  undefined8 local_5e18;
  undefined8 local_5e08;
  uint auStack_5df8 [1000];
  long alStack_4e58 [1000];
  uint auStack_2f18 [1000];
  ulong auStack_1f78 [1001];
  
  if (in_AL != '\0') {
    local_5e78 = in_XMM0_Da;
    local_5e68 = in_XMM1_Qa;
    local_5e58 = in_XMM2_Qa;
    local_5e48 = in_XMM3_Qa;
    local_5e38 = in_XMM4_Qa;
    local_5e28 = in_XMM5_Qa;
    local_5e18 = in_XMM6_Qa;
    local_5e08 = in_XMM7_Qa;
  }
  __env = (__jmp_buf_tag *)(MshIdx + 0x48);
  p_Var28 = __env;
  iVar5 = _setjmp(__env);
  iVar6 = 0;
  iVar7 = 0;
  if ((0xffffff0f < KwdCod - 0xf1U) && (iVar7 = iVar6, iVar5 == 0)) {
    lVar1 = MshIdx + (long)KwdCod * 0x3300;
    if ((*(ulong *)(lVar1 + 0x10d8) != 0) &&
       ((((*(uint *)(lVar1 + 0x110) & 0xfffffffe) == 2 &&
         (local_5eb0 = BegIdx - 1, local_5eb0 < (ulong)EndIdx)) &&
        ((ulong)EndIdx <= *(ulong *)(lVar1 + 0x10d8))))) {
      if (MapTyp == 10) {
        pvVar25 = MapTab;
        MapTab = (void *)0x0;
      }
      else {
        pvVar25 = (void *)0x0;
        if (MapTyp != 0xb) {
          pvVar25 = (void *)0x0;
          MapTab = (void *)0x0;
        }
      }
      local_6000 = &stack0x00000010;
      if (prc == (void *)0x0) {
        uVar8 = 0;
      }
      else {
        local_6000 = (ulong *)&stack0x00000018;
        uVar8 = in_stack_00000010;
      }
      if ((*(uint *)(lVar1 + 0x110) & 0xfffffffe) != 2) {
        longjmp(__env,-0x24);
      }
      lVar20 = EndIdx - BegIdx;
      uVar19 = (uint)*local_6000;
      local_5ee8 = (ulong)uVar19;
      local_5ee0 = lVar20;
      local_5ed8 = local_5eb0;
      puVar21 = (ulong *)((long)local_6000 + 8);
      if (uVar19 == 100) {
        local_5ee8 = *(ulong *)((long)local_6000 + 8);
        p_Var28 = *(__jmp_buf_tag **)((long)local_6000 + 0x18);
        local_5ee0 = *(long *)((long)local_6000 + 0x10);
        local_5ed8 = *(ulong *)((long)local_6000 + 0x20);
        puVar21 = (ulong *)((long)local_6000 + 0x28);
      }
      local_6000 = puVar21;
      lVar17 = lVar20 + 1;
      iVar7 = *(int *)(lVar1 + 0x11c);
      if ((long)iVar7 < 1) {
        lVar20 = 0;
      }
      else {
        iVar6 = 0;
        bVar35 = true;
        uVar18 = 0x30;
        uVar14 = 0x30;
        uVar26 = uVar19;
        iVar5 = iVar6;
        do {
          uVar30 = (uint)uVar18;
          if (uVar19 == 100) {
            lVar9 = (long)iVar6;
            uVar26 = *(uint *)(local_5ee8 + lVar9 * 4);
            if ((uVar26 & 0xfffffffc) == 0xc) {
              uVar26 = uVar26 - 4;
              uVar27 = *(uint *)(local_5ee0 + lVar9 * 4);
            }
            else {
              uVar27 = 1;
              if (uVar26 - 1 < 4) {
                uVar27 = *(uint *)(MshIdx + 0x1c + (ulong)uVar26 * 4);
                uVar26 = *(int *)(MshIdx + 4) == 1 ^ 9;
              }
            }
            uVar34 = p_Var28->__jmpbuf[lVar9];
            puVar21 = (ulong *)(local_5ed8 + lVar9 * 8);
            iVar6 = iVar6 + 1;
          }
          else {
            if (!bVar35) {
              if ((uint)uVar14 < 0x29) {
                puVar21 = (ulong *)((long)local_5ea8 + uVar14);
                uVar30 = (uint)uVar14 + 8;
                uVar14 = (ulong)uVar30;
              }
              else {
                puVar21 = local_6000;
                local_6000 = local_6000 + 1;
              }
              uVar26 = (uint)*puVar21;
              uVar18 = (ulong)uVar30;
            }
            uVar30 = (uint)uVar14;
            if ((uVar26 & 0xfffffffc) == 0xc) {
              if (uVar30 < 0x29) {
                uVar30 = uVar30 + 8;
                uVar18 = (ulong)uVar30;
                puVar21 = (ulong *)((long)local_5ea8 + uVar14);
              }
              else {
                puVar21 = local_6000;
                local_6000 = local_6000 + 1;
              }
              uVar26 = uVar26 - 4;
              uVar27 = (uint)*puVar21;
            }
            else {
              uVar27 = 1;
              if (uVar26 - 1 < 4) {
                uVar27 = *(uint *)(MshIdx + 0x1c + (ulong)uVar26 * 4);
                uVar26 = *(int *)(MshIdx + 4) == 1 ^ 9;
              }
            }
            if (uVar30 < 0x29) {
              uVar18 = (ulong)(uVar30 + 8);
              puVar21 = (ulong *)((long)local_5ea8 + (ulong)uVar30);
            }
            else {
              puVar21 = local_6000;
              local_6000 = local_6000 + 1;
            }
            uVar34 = *puVar21;
            if ((uint)uVar18 < 0x29) {
              puVar21 = (ulong *)((long)local_5ea8 + uVar18);
              uVar18 = (ulong)((uint)uVar18 + 8);
            }
            else {
              puVar21 = local_6000;
              local_6000 = local_6000 + 1;
            }
            bVar35 = false;
            uVar14 = uVar18;
          }
          if (lVar17 < 2) {
            lVar9 = 0;
          }
          else {
            lVar9 = (long)(*puVar21 - uVar34) / lVar20;
          }
          if (0 < (int)uVar27) {
            iVar3 = *(int *)(&DAT_0010c170 + (long)(int)uVar26 * 4);
            uVar32 = 0;
            do {
              auStack_5df8[(long)iVar5 + uVar32] = uVar26;
              auStack_1f78[(long)iVar5 + uVar32] = uVar34;
              alStack_4e58[(long)iVar5 + uVar32] = lVar9;
              uVar32 = uVar32 + 1;
              uVar34 = uVar34 + (long)iVar3;
            } while (uVar27 != uVar32);
            iVar5 = iVar5 + (int)uVar32;
          }
        } while (iVar5 < iVar7);
        if (iVar7 < 1) {
          lVar20 = 0;
        }
        else {
          lVar9 = 0;
          lVar20 = lVar9;
          do {
            if (*(char *)(lVar1 + 0x10e8 + lVar9) == 'r') {
              bVar35 = *(int *)(MshIdx + 0x18) != 0x20;
              uVar14 = (ulong)bVar35;
              uVar19 = bVar35 + 8;
            }
            else {
              bVar35 = *(int *)(MshIdx + 4) < 4;
              uVar19 = bVar35 ^ 0xb;
              uVar14 = (ulong)bVar35 ^ 3;
            }
            auStack_2f18[lVar9] = uVar19;
            lVar20 = lVar20 + *(int *)(&DAT_0010c190 + uVar14 * 4);
            lVar9 = lVar9 + 1;
          } while (iVar7 != lVar9);
        }
      }
      local_5ed0 = p_Var28;
      fseek(*(FILE **)(MshIdx + 0x300410),*(long *)(lVar1 + 0x10e0),0);
      if ((*(byte *)(MshIdx + 0xc) & 1) == 0) {
        pdVar10 = (double *)malloc(lVar20 * 10000);
        if (pdVar10 == (double *)0x0) {
          longjmp(__env,-0x25);
        }
        local_5ec0 = (double *)malloc(lVar20 * 10000);
        if (local_5ec0 == (double *)0x0) {
          longjmp(__env,-0x26);
        }
        local_5f48.aio_nbytes = 0;
        local_5f48.aio_lio_opcode = 0;
        local_5f48._36_4_ = 0;
        local_5f48.aio_fildes = *(FILE **)(MshIdx + 0x300410);
        local_5f48.aio_buf = pdVar10;
        local_5eb8 = local_5ec0;
        lVar9 = ftell((FILE *)local_5f48.aio_fildes);
        local_5f48.aio_offset = local_5eb0 * lVar20 + lVar9;
        lVar22 = -(lVar17 >> 0x3f);
        lVar9 = lVar17 / 10000 + (lVar17 >> 0x3f);
        uVar18 = lVar9 + lVar22;
        uVar32 = lVar9 + lVar22 + 1;
        uVar29 = 0;
        uVar14 = uVar29;
        pdVar11 = pdVar10;
        uVar34 = uVar29;
        local_5ec8 = pdVar10;
        do {
          if (uVar29 != 0) {
            if (local_5f48.aio_lio_opcode != 0) {
              if (local_5f48.aio_lio_opcode != 0x73) {
                pcVar15 = strerror(local_5f48.aio_lio_opcode);
                printf(" Error at aio_error() : %s\n",pcVar15);
                longjmp(__env,-0x27);
              }
              do {
              } while( true );
            }
            local_5f48.aio_offset = local_5f48.aio_offset + local_5f48.aio_nbytes;
            bVar35 = (double *)local_5f48.aio_buf == pdVar10;
            pdVar11 = local_5ec0;
            local_5f48.aio_buf = pdVar10;
            if (bVar35) {
              pdVar11 = pdVar10;
              local_5f48.aio_buf = local_5ec0;
            }
          }
          local_5ef0 = uVar29;
          if (uVar18 < uVar29) {
LAB_0010947a:
            lVar9 = (uVar29 - 1) * -10000 + lVar17;
            if (uVar29 - 1 != uVar18) {
              lVar9 = 10000;
            }
            if (0 < lVar9) {
              iVar7 = *(int *)(lVar1 + 0x11c);
              lVar22 = 0;
              uVar29 = uVar14;
              pdVar31 = pdVar11;
              do {
                uVar14 = uVar29 + 1;
                if (0 < iVar7) {
                  uVar24 = 0;
                  do {
                    if (*(int *)(MshIdx + 0x10) != 1) {
                      uVar19 = *(uint *)(&DAT_0010c170 + (long)(int)auStack_2f18[uVar24] * 4);
                      lVar12 = (ulong)uVar19 - 1;
                      lVar23 = 0;
                      pdVar33 = pdVar31;
                      do {
                        uVar2 = *(undefined1 *)((long)pdVar31 + lVar23 + lVar12);
                        *(undefined1 *)((long)pdVar31 + lVar23 + lVar12) = *(undefined1 *)pdVar33;
                        *(undefined1 *)pdVar33 = uVar2;
                        lVar23 = lVar23 + -1;
                        pdVar33 = (double *)((long)pdVar33 + 1);
                      } while (-lVar23 != (ulong)(uVar19 >> 1));
                    }
                    iVar7 = (int)uVar24;
                    if ((*(long *)(lVar1 + 0x10c8) != 0) && (uVar24 != *(int *)(lVar1 + 0x11c) - 1))
                    {
                      iVar7 = *(int *)(*(long *)(lVar1 + 0x10c8) + uVar24 * 4);
                    }
                    uVar4 = auStack_1f78[iVar7];
                    if (pvVar25 == (void *)0x0) {
                      if (MapTab != (void *)0x0) {
                        lVar12 = *(long *)((long)MapTab + uVar14 * 8);
                        goto LAB_00109564;
                      }
                      lVar12 = alStack_4e58[iVar7] * uVar29;
                    }
                    else {
                      lVar12 = (long)*(int *)((long)pvVar25 + uVar14 * 4);
LAB_00109564:
                      lVar12 = (lVar12 + -1) * alStack_4e58[iVar7];
                    }
                    uVar19 = auStack_2f18[uVar24];
                    switch(uVar19) {
                    case 8:
                      fVar36 = *(float *)pdVar31;
                      if (auStack_5df8[uVar24] != 8) {
                        dVar13 = (double)fVar36;
                        goto LAB_001095d7;
                      }
LAB_001095f7:
                      *(float *)(uVar4 + lVar12) = fVar36;
                      break;
                    case 9:
                      dVar13 = *pdVar31;
                      if (auStack_5df8[uVar24] != 9) {
                        fVar36 = (float)dVar13;
                        goto LAB_001095f7;
                      }
LAB_001095d7:
                      *(double *)(uVar4 + lVar12) = dVar13;
                      break;
                    case 10:
                      dVar13 = (double)(ulong)(uint)*(float *)pdVar31;
                      if (auStack_5df8[uVar24] != 10) {
                        dVar13 = (double)(long)(int)*(float *)pdVar31;
                        goto LAB_001095c2;
                      }
LAB_001095ed:
                      *(int *)(uVar4 + lVar12) = SUB84(dVar13,0);
                      break;
                    case 0xb:
                      dVar13 = *pdVar31;
                      if (auStack_5df8[uVar24] != 0xb) goto LAB_001095ed;
LAB_001095c2:
                      *(double *)(uVar4 + lVar12) = dVar13;
                    }
                    pdVar31 = (double *)
                              ((long)pdVar31 + (long)*(int *)(&DAT_0010c170 + (long)(int)uVar19 * 4)
                              );
                    uVar24 = uVar24 + 1;
                    iVar7 = *(int *)(lVar1 + 0x11c);
                    local_5ef8 = lVar22;
                  } while ((long)uVar24 < (long)iVar7);
                }
                lVar22 = lVar22 + 1;
                uVar29 = uVar14;
              } while (lVar22 != lVar9);
            }
            uVar24 = lVar9 + uVar34;
            if (prc != (void *)0x0) {
              local_5f20 = uVar14;
              (*(code *)prc)(uVar34 + 1,uVar24,uVar8);
              uVar14 = local_5f20;
            }
          }
          else {
            local_5f18 = uVar29 * -10000 + lVar17;
            if (uVar29 != uVar18) {
              local_5f18 = 10000;
            }
            local_5f48.aio_nbytes = local_5f18 * lVar20;
            local_5f10 = uVar14;
            iVar7 = my_aio_read(&local_5f48);
            if (iVar7 == -1) {
              printf("block      = %zd / %zd\n",uVar29 + 1,uVar32);
              printf("size       = %ld lines\n",local_5f18);
              printf("aio_fildes = %p\n",local_5f48.aio_fildes);
              printf("aio_buf    = %p\n",local_5f48.aio_buf);
              printf("aio_offset = %ld\n",local_5f48.aio_offset);
              printf("aio_nbytes = %ld\n",local_5f48.aio_nbytes);
              puVar16 = (uint *)__errno_location();
              printf("errno      = %d\n",(ulong)*puVar16);
              longjmp(__env,-0x29);
            }
            uVar14 = local_5f10;
            uVar24 = uVar34;
            if (uVar29 != 0) goto LAB_0010947a;
          }
          uVar34 = uVar24;
          uVar29 = local_5ef0 + 1;
        } while (uVar29 <= uVar32);
        free(local_5ec8);
        free(local_5eb8);
      }
      else {
        lVar20 = 1;
        local_5f00 = 1;
        do {
          iVar7 = *(int *)(lVar1 + 0x11c);
          if (0 < iVar7) {
            local_5f08 = lVar20 + -1;
            uVar14 = 0;
            do {
              if ((*(long *)(lVar1 + 0x10c8) == 0) || (uVar14 == iVar7 - 1)) {
                iVar7 = (int)uVar14;
              }
              else {
                iVar7 = *(int *)(*(long *)(lVar1 + 0x10c8) + uVar14 * 4);
              }
              if (pvVar25 == (void *)0x0) {
                if (MapTab != (void *)0x0) {
                  lVar17 = *(long *)((long)MapTab + lVar20 * 8);
                  goto LAB_00109734;
                }
                lVar17 = alStack_4e58[iVar7] * local_5f08;
              }
              else {
                lVar17 = (long)*(int *)((long)pvVar25 + lVar20 * 4);
LAB_00109734:
                lVar17 = (lVar17 + -1) * alStack_4e58[iVar7];
              }
              iVar7 = __isoc99_fscanf(*(undefined8 *)(MshIdx + 0x300410),
                                      &DAT_0010c290 +
                                      (int)(&UINT_0010c270)[(int)auStack_5df8[uVar14]],
                                      lVar17 + auStack_1f78[iVar7]);
              if (iVar7 != 1) {
                longjmp(__env,-1);
              }
              uVar14 = uVar14 + 1;
              iVar7 = *(int *)(lVar1 + 0x11c);
            } while ((long)uVar14 < (long)iVar7);
          }
          uVar14 = local_5f00;
          lVar20 = (lVar20 + 1) - (ulong)(local_5f00 < (ulong)BegIdx);
          if (prc != (void *)0x0) {
            (*(code *)prc)(1,*(undefined8 *)(lVar1 + 0x10d8),uVar8);
          }
          local_5f00 = uVar14 + 1;
        } while (local_5f00 <= (ulong)EndIdx);
      }
      iVar7 = 1;
    }
  }
  return iVar7;
}

Assistant:

int GmfGetBlock(  int64_t MshIdx, int KwdCod, int64_t BegIdx, int64_t EndIdx,
                  int MapTyp, void *MapTab, void *prc, ... )
{
   char        *UsrDat[ GmfMaxTyp ], *UsrBas[ GmfMaxTyp ], *FilPos, *EndUsrDat;
   char        *FilBuf = NULL, *FrtBuf = NULL, *BckBuf = NULL, *BegUsrDat;
   char        *StrTab[4] = { "%f", "%lf", "%d", INT64_T_FMT };
   char        **BegTab, **EndTab;
   int         i, j, k, *FilPtrI32, *UsrPtrI32, FilTyp[ GmfMaxTyp ];
   int         UsrTyp[ GmfMaxTyp ], TypSiz[4] = {4,8,4,8};
   int         *IntMapTab = NULL, err, TotSiz = 0, IniFlg = 1, mod = GmfArgLst;
   int         *TypTab, *SizTab, typ, VecCnt, ArgCnt = 0;
   float       *FilPtrR32, *UsrPtrR32;
   double      *FilPtrR64, *UsrPtrR64;
   int64_t     BlkNmbLin, *FilPtrI64, *UsrPtrI64, BlkBegIdx, BlkEndIdx = 0;
   int64_t     *LngMapTab = NULL, OldIdx = 0, UsrNmbLin, VecLen;
   size_t      FilBegIdx = BegIdx, FilEndIdx = EndIdx;
   void        (*UsrPrc)(int64_t, int64_t, void *) = NULL;
   size_t      UsrLen[ GmfMaxTyp ], ret, LinSiz, b, l, NmbBlk;
   va_list     VarArg;
   GmfMshSct   *msh = (GmfMshSct *)MshIdx;
   KwdSct      *kwd = &msh->KwdTab[ KwdCod ];
   struct      aiocb aio;
   char        *UsrArg = NULL;

   // Save the current stack environment for longjmp
   if( (err = setjmp(msh->err)) != 0)
   {
#ifdef GMFDEBUG
      printf("libMeshb : mesh %p : error %d\n", msh, err);
#endif
      if(BckBuf)
         free(BckBuf);

      if(FrtBuf)
         free(FrtBuf);

      return(0);
   }

   // Check mesh and keyword
   if( (KwdCod < 1) || (KwdCod > GmfMaxKwd) || !kwd->NmbLin )
      return(0);

   // Make sure it's not a simple information keyword
   if( (kwd->typ != RegKwd) && (kwd->typ != SolKwd) )
      return(0);

   // Check user's bounds
   if( (FilBegIdx < 1) || (FilBegIdx > FilEndIdx) || (FilEndIdx > (size_t)kwd->NmbLin) )
      return(0);

   // Compute the number of lines to be read
   UsrNmbLin = FilEndIdx - FilBegIdx + 1;

   // Get the renumbering map if any
   if(MapTyp == GmfInt)
      IntMapTab = (int *)MapTab;
   else if(MapTyp == GmfLong)
      LngMapTab = (int64_t *)MapTab;

   // Start decoding the arguments
   va_start(VarArg, prc);
   LinSiz = 0;

   // Get the user's preprocessing procedure and argument adresses, if any
   if(prc)
   {
      UsrPrc = (void (*)(int64_t, int64_t, void *))prc;
      UsrArg = va_arg(VarArg, void *);
   }

   if( (kwd->typ != RegKwd) && (kwd->typ != SolKwd) )
      longjmp(msh->err, -36);

   // Read the first data type to select between list and table mode
   typ = va_arg(VarArg, int);

   // If the table mode is selected, read the four additional tables
   // containing the arguments: type, vector size, begin and end pointers
   if(typ == GmfArgTab)
   {
      mod = GmfArgTab;
      TypTab = va_arg(VarArg, int *);
      SizTab = va_arg(VarArg, int *);
      BegTab = va_arg(VarArg, char **);
      EndTab = va_arg(VarArg, char **);
   }

   // Read the arguments until to total size reaches the keyword's size
   while(TotSiz < kwd->SolSiz)
   {
      // In list mode all arguments are read from the variable argument buffer
      if(mod == GmfArgLst)
      {
         // Do not read the type argument for the first iteration because
         // it was read befeore the loop begins to get the argument mode
         if(IniFlg)
            IniFlg = 0;
         else
            typ = va_arg(VarArg, int);

         if(typ >= GmfFloatVec && typ <= GmfLongVec)
         {
            // In case the type is a vector, get its size and change
            // the type for the corresponding scalar type
            typ -= 4;
            VecCnt = va_arg(VarArg, int);
         }
         else if(typ >= GmfSca && typ <= GmfMat)
         {
            // In case it is a mathematical solution, expand it
            // to the right size with the mesh file's own real kind
            VecCnt = msh->SolTypSiz[ typ ];
            typ = (msh->ver == 1) ? GmfFloat : GmfDouble;
         }
         else
            VecCnt = 1;

         BegUsrDat = va_arg(VarArg, char *);
         EndUsrDat = va_arg(VarArg, char *);
      }
      else
      {
         // Do exactly the same as above but the arguments are read from
         // the tables instead of VarArgs
         typ = TypTab[ ArgCnt ];

         if(typ >= GmfFloatVec && typ <= GmfLongVec)
         {
            typ -= 4;
            VecCnt = SizTab[ ArgCnt ];
         }
         else if(typ >= GmfSca && typ <= GmfMat)
         {
            // In case it is a mathematical solution, expand it
            //  to the right size with the mesh file's own real kind
            VecCnt = msh->SolTypSiz[ typ ];
            typ = (msh->ver == 1) ? GmfFloat : GmfDouble;
         }
         else
            VecCnt = 1;

         BegUsrDat = (char *)BegTab[ ArgCnt ];
         EndUsrDat = (char *)EndTab[ ArgCnt ];
         ArgCnt++;
      }

      if(UsrNmbLin > 1)
      {
         VecLen = (size_t)(EndUsrDat - BegUsrDat);
         VecLen /= UsrNmbLin - 1;
      }
      else
         VecLen = 0;

      // Compute the consecutive begin / end adresses for vector data types
      for(i=0;i<VecCnt;i++)
      {
         UsrTyp[ TotSiz ]  = typ;
         UsrBas[ TotSiz ]  = BegUsrDat + i * TypSiz[ typ - GmfFloat ];
         UsrDat[ TotSiz ]  = UsrBas[ TotSiz ];
         UsrLen[ TotSiz ]  = VecLen;
         TotSiz++;
      }
   }

   // Get the file's data type
   for(i=0;i<kwd->SolSiz;i++)
   {
      if(kwd->fmt[i] == 'r')
         if(msh->FltSiz == 32)
            FilTyp[i] = GmfFloat;
         else
            FilTyp[i] = GmfDouble;
      else
         if(msh->ver <= 3)
            FilTyp[i] = GmfInt;
         else
            FilTyp[i] = GmfLong;

      // Compute the file stride
      LinSiz += TypSiz[ FilTyp[i] - GmfFloat ];
   }

   va_end(VarArg);

   // Move file pointer to the keyword data
   SetFilPos(msh, kwd->pos);

   // Read the whole kwd data
   if(msh->typ & Asc)
   {
      OldIdx = 1;

      for(l=1;l<=FilEndIdx;l++)
      {
         for(j=0;j<kwd->SolSiz;j++)
         {
            // Reorder HO nodes on the fly
            if(kwd->OrdTab && (j != kwd->SolSiz-1))
               k = kwd->OrdTab[j];
            else
               k = j;

            // Move to the next user's data line only when the desired
            // begining position in the ascii file has been reached since
            // we cannot move directly to an arbitrary position
            if(IntMapTab)
               UsrDat[j] = UsrBas[k] + (IntMapTab[ OldIdx ] - 1) * UsrLen[k];
            else if(LngMapTab)
               UsrDat[j] = UsrBas[k] + (LngMapTab[ OldIdx ] - 1) * UsrLen[k];
            else
               UsrDat[j] = UsrBas[k] + (OldIdx - 1) * UsrLen[k];

            safe_fscanf(msh->hdl, StrTab[ UsrTyp[j] - GmfFloat ], UsrDat[j], msh->err);
         }

         if(l >= FilBegIdx)
            OldIdx++;

         // Call the user's preprocessing procedure
         if(UsrPrc)
            UsrPrc(1, kwd->NmbLin, UsrArg);
      }
   }
   else
   {
      // Allocate both front and back buffers
      if(!(BckBuf = malloc(BufSiz * LinSiz)))
         longjmp(msh->err, -37);

      if(!(FrtBuf = malloc(BufSiz * LinSiz)))
         longjmp(msh->err, -38);

      // Setup the ansynchonous parameters
      memset(&aio, 0, sizeof(struct aiocb));
      FilBuf = BckBuf;
      aio.aio_buf = BckBuf;
#ifdef WITH_GMF_AIO
      aio.aio_fildes = msh->FilDes;
#else
      aio.aio_fildes = msh->hdl;
#endif
      aio.aio_offset = (size_t)(GetFilPos(msh) + (FilBegIdx-1) * LinSiz);

      NmbBlk = UsrNmbLin / BufSiz;

      // Loop over N+1 blocks
      for(b=0;b<=NmbBlk+1;b++)
      {
         // Wait for the previous block read to complete except
         // for the first loop interation
         if(b)
         {
            while(my_aio_error(&aio) == EINPROGRESS);

            err = my_aio_error(&aio);
            ret = my_aio_return(&aio);

            if (err != 0) {
              printf (" Error at aio_error() : %s\n", strerror (err));
              longjmp(msh->err, -39);
            }

            if (ret != aio.aio_nbytes) {
              printf(" Error at aio_return()\n");
              longjmp(msh->err, -40);
            }

            // Increment the reading position
            aio.aio_offset += (size_t)aio.aio_nbytes;

            // and swap the buffers
            if(aio.aio_buf == BckBuf)
            {
               aio.aio_buf = FrtBuf;
               FilBuf = BckBuf;
            }
            else
            {
               aio.aio_buf = BckBuf;
               FilBuf = FrtBuf;
            }
         }
 
         // Read a chunk of data except for the last loop interarion
         if(b <= NmbBlk)
         {
            // The last block is shorter than the others
            if(b == NmbBlk)
               BlkNmbLin = UsrNmbLin - b * BufSiz;
            else
               BlkNmbLin = BufSiz;

            aio.aio_nbytes = BlkNmbLin * LinSiz;

            if(my_aio_read(&aio) == -1)
            {
               printf("block      = %zd / %zd\n", b+1, NmbBlk+1);
               printf("size       = "INT64_T_FMT" lines\n", BlkNmbLin);
#ifdef WITH_GMF_AIO
               printf("aio_fildes = %d\n",aio.aio_fildes);
#else
               printf("aio_fildes = %p\n",aio.aio_fildes);
#endif
               printf("aio_buf    = %p\n",aio.aio_buf);
               printf("aio_offset = " INT64_T_FMT "\n",(int64_t)aio.aio_offset);
               printf("aio_nbytes = " INT64_T_FMT "\n",(int64_t)aio.aio_nbytes);
               printf("errno      = %d\n",errno);
               longjmp(msh->err, -41);
            }
         }

         // Then decode the block and store it in the user's data structure
         // except for the first loop interation
         if(b)
         {
            // The last block is shorter than the others
            if(b-1 == NmbBlk)
               BlkNmbLin = UsrNmbLin - (b-1) * BufSiz;
            else
               BlkNmbLin = BufSiz;

            BlkBegIdx = BlkEndIdx+1;
            BlkEndIdx += BlkNmbLin;
            FilPos = FilBuf;

            for(i=0;i<BlkNmbLin;i++)
            {
               OldIdx++;

               for(j=0;j<kwd->SolSiz;j++)
               {
                  if(msh->cod != 1)
                     SwpWrd(FilPos, TypSiz[ FilTyp[j] - GmfFloat ]);

                  // Reorder HO nodes on the fly
                  if(kwd->OrdTab && (j != kwd->SolSiz-1))
                     k = kwd->OrdTab[j];
                  else
                     k = j;

                  if(IntMapTab)
                     UsrDat[j] = UsrBas[k] + (IntMapTab[ OldIdx ] - 1) * UsrLen[k];
                  else if(LngMapTab)
                     UsrDat[j] = UsrBas[k] + (LngMapTab[ OldIdx ] - 1) * UsrLen[k];
                  else
                     UsrDat[j] = UsrBas[k] + (OldIdx - 1) * UsrLen[k];

                  if(FilTyp[j] == GmfInt)
                  {
                     FilPtrI32 = (int *)FilPos;

                     if(UsrTyp[j] == GmfInt)
                     {
                        UsrPtrI32 = (int *)UsrDat[j];
                        *UsrPtrI32 = *FilPtrI32;
                     }
                     else
                     {
                        UsrPtrI64 = (int64_t *)UsrDat[j];
                        *UsrPtrI64 = (int64_t)*FilPtrI32;
                     }
                  }
                  else if(FilTyp[j] == GmfLong)
                  {
                     FilPtrI64 = (int64_t *)FilPos;

                     if(UsrTyp[j] == GmfLong)
                     {
                        UsrPtrI64 = (int64_t *)UsrDat[j];
                        *UsrPtrI64 = *FilPtrI64;
                     }
                     else
                     {
                        UsrPtrI32 = (int *)UsrDat[j];
                        *UsrPtrI32 = (int)*FilPtrI64;
                     }
                  }
                  else if(FilTyp[j] == GmfFloat)
                  {
                     FilPtrR32 = (float *)FilPos;

                     if(UsrTyp[j] == GmfFloat)
                     {
                        UsrPtrR32 = (float *)UsrDat[j];
                        *UsrPtrR32 = *FilPtrR32;
                     }
                     else
                     {
                        UsrPtrR64 = (double *)UsrDat[j];
                        *UsrPtrR64 = (double)*FilPtrR32;
                     }
                  }
                  else if(FilTyp[j] == GmfDouble)
                  {
                     FilPtrR64 = (double *)FilPos;

                     if(UsrTyp[j] == GmfDouble)
                     {
                        UsrPtrR64 = (double *)UsrDat[j];
                        *UsrPtrR64 = *FilPtrR64;
                     }
                     else
                     {
                        UsrPtrR32 = (float *)UsrDat[j];
                        *UsrPtrR32 = (float)*FilPtrR64;
                     }
                  }

                  FilPos += TypSiz[ FilTyp[j] - GmfFloat ];
               }
            }

            // Call the user's preprocessing procedure
            if(UsrPrc)
               UsrPrc(BlkBegIdx, BlkEndIdx, UsrArg);
         }
      }

      free(BckBuf);
      free(FrtBuf);
   }

   return(1);
}